

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O0

void __thiscall wasm::ReferenceFinder::visitCallIndirect(ReferenceFinder *this,CallIndirect *curr)

{
  ModuleElement element;
  ModuleItemKind local_34;
  pair<wasm::ModuleItemKind,_wasm::Name> local_30;
  CallIndirect *local_18;
  CallIndirect *curr_local;
  ReferenceFinder *this_local;
  
  local_34 = Table;
  local_18 = curr;
  curr_local = (CallIndirect *)this;
  std::pair<wasm::ModuleItemKind,_wasm::Name>::pair<wasm::ModuleItemKind,_wasm::Name_&,_true>
            (&local_30,&local_34,&curr->table);
  element.second.super_IString.str._M_len = local_30.second.super_IString.str._M_len;
  element.first = local_30.first;
  element._4_4_ = local_30._4_4_;
  element.second.super_IString.str._M_str = local_30.second.super_IString.str._M_str;
  note(this,element);
  noteCallRef(this,(HeapType)(local_18->heapType).id);
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    note({ModuleElementKind::Table, curr->table});
    // Note a possible call of a function reference as well, as something might
    // be written into the table during runtime. With precise tracking of what
    // is written into the table we could do better here; we could also see
    // which tables are immutable. TODO
    noteCallRef(curr->heapType);
  }